

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

RPCHelpMan * wallet::gethdkeys(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  long *plVar4;
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  RPCExamples examples;
  string description_09;
  string description_10;
  string description_11;
  vector<RPCArg,_std::allocator<RPCArg>_> inner;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar5 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long *plVar7;
  RPCHelpMan *in_RDI;
  undefined8 uVar8;
  long lVar9;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_05;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_06;
  undefined4 in_stack_ffffffffffffec98;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffec9c;
  undefined1 *puVar11;
  undefined4 uVar12;
  undefined8 in_stack_ffffffffffffeca8;
  undefined8 in_stack_ffffffffffffecb0;
  undefined8 in_stack_ffffffffffffecb8;
  code *pcVar13;
  undefined8 in_stack_ffffffffffffecc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffecc8;
  _Vector_impl_data in_stack_ffffffffffffecd8;
  _Vector_impl_data in_stack_ffffffffffffecf0;
  undefined1 in_stack_ffffffffffffed08 [16];
  pointer in_stack_ffffffffffffed18;
  pointer pRVar14;
  pointer in_stack_ffffffffffffed20;
  pointer pRVar15;
  pointer in_stack_ffffffffffffed28;
  undefined8 in_stack_ffffffffffffed30;
  pointer in_stack_ffffffffffffed38;
  pointer in_stack_ffffffffffffed40;
  pointer in_stack_ffffffffffffed48;
  undefined1 in_stack_ffffffffffffed50 [48];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1278;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1258;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1238;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1220;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1208;
  RPCResults local_11f0;
  allocator_type local_11d4;
  allocator_type local_11d3;
  bool local_11d2;
  bool local_11d1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_11d0 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_11a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1128;
  undefined1 local_10b0 [32];
  undefined1 local_1090 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1080;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1070;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ff8;
  string local_f80;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  string local_ec0;
  string local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  ulong *local_e40;
  undefined8 local_e38;
  ulong local_e30;
  undefined8 uStack_e28;
  ulong *local_e20;
  size_type local_e18;
  ulong local_e10;
  undefined8 uStack_e08;
  long *local_e00 [2];
  long local_df0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_de0;
  long *local_dc0 [2];
  long local_db0 [2];
  pointer local_da0 [2];
  undefined1 local_d90 [152];
  RPCResult local_cf8;
  long *local_c70 [2];
  long local_c60 [2];
  long *local_c50 [2];
  long local_c40 [2];
  RPCResult local_c30;
  long *local_ba8 [2];
  long local_b98 [2];
  long *local_b88 [2];
  long local_b78 [2];
  long *local_b68 [2];
  long local_b58 [2];
  long *local_b48 [2];
  long local_b38 [2];
  long *local_b28 [2];
  long local_b18 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_b08;
  long *local_ae8 [2];
  long local_ad8 [2];
  pointer local_ac8 [2];
  undefined1 local_ab8 [152];
  RPCResult local_a20;
  RPCResult local_998;
  RPCResult local_910;
  long *local_888 [2];
  long local_878 [2];
  long *local_868 [2];
  long local_858 [2];
  RPCResult local_848;
  long *local_7c0 [2];
  long local_7b0 [2];
  long *local_7a0 [2];
  long local_790 [2];
  RPCResult local_780;
  undefined1 local_6f8 [8];
  undefined1 *local_6f0;
  undefined8 local_6e8;
  undefined1 local_6e0;
  undefined7 uStack_6df;
  undefined1 local_6d0 [32];
  undefined1 local_6b0;
  undefined1 *local_6a8;
  undefined8 local_6a0;
  undefined1 local_698;
  undefined7 uStack_697;
  undefined1 local_688 [32];
  long *local_668 [2];
  long local_658 [2];
  UniValue local_648;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5f0;
  undefined1 local_598;
  long *local_590 [2];
  long local_580 [2];
  undefined1 local_570;
  undefined1 *local_568;
  undefined8 local_560;
  undefined1 local_558;
  undefined7 uStack_557;
  undefined1 local_548 [32];
  long *local_528 [2];
  long local_518;
  undefined1 auStack_510 [8];
  undefined1 local_508 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  vector<UniValue,_std::allocator<UniValue>_> local_4c8;
  undefined1 local_4b0 [40];
  long local_488 [6];
  __index_type local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  RPCArg local_430;
  RPCArg local_328;
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1070.second.val.field_2._8_8_ = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"gethdkeys","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nList all BIP 32 HD keys in the wallet and which descriptors use them.\n","");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"options","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"");
  local_450.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_450.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"active_only","");
  local_11d1 = false;
  ::UniValue::UniValue<bool,_bool,_true>((UniValue *)local_508,&local_11d1);
  local_4b0._8_8_ = local_4b0 + 0x18;
  local_4b0._0_4_ = local_508._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._8_8_ == &local_4f0) {
    local_4b0._32_8_ = local_4f0._8_8_;
  }
  else {
    local_4b0._8_8_ = local_508._8_8_;
  }
  local_4b0._16_8_ = local_508._16_8_;
  local_508._16_8_ = 0;
  local_4f0._M_local_buf[0] = '\0';
  local_488[0] = (long)local_4e0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_488[1] = (long)local_4e0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_488[2] = (long)local_4e0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488[3]._0_4_ =
       local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_488[3]._4_4_ =
       local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_488[4]._0_4_ =
       local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_488[4]._4_4_ =
       local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_488[5] = (long)local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_458 = '\x02';
  local_528[0] = &local_518;
  local_508._8_8_ = &local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_528,"Show the keys for only active descriptors","");
  local_568 = &local_558;
  local_570 = 0;
  local_560 = 0;
  local_558 = 0;
  local_548._0_8_ = (pointer)0x0;
  local_548._8_2_ = 0;
  local_548._10_6_ = 0;
  local_548._16_2_ = 0;
  local_548._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec9c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec98;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  name.field_2._8_8_ = in_stack_ffffffffffffecb0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffecc0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffecb8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffecc8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffecd8._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffecd8._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffecd8._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffecf0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffecf0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffecf0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffed08;
  description_09._M_string_length = (size_type)in_stack_ffffffffffffed20;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed18;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffed28;
  description_09.field_2._8_8_ = in_stack_ffffffffffffed30;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed40;
  opts._0_8_ = in_stack_ffffffffffffed38;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffed48;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed50._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffed50._16_24_;
  opts.hidden = (bool)in_stack_ffffffffffffed50[0x28];
  opts.also_positional = (bool)in_stack_ffffffffffffed50[0x29];
  opts._66_6_ = in_stack_ffffffffffffed50._42_6_;
  ::RPCArg::RPCArg(&local_430,name,(Type)&local_450,fallback,description_09,opts);
  local_590[0] = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"private","");
  local_11d2 = false;
  ::UniValue::UniValue<bool,_bool,_true>(&local_648,&local_11d2);
  paVar1 = &local_648.val.field_2;
  local_5f0._8_8_ = (long)&local_5f0 + 0x18;
  local_5f0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_648.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648.val._M_dataplus._M_p == paVar1) {
    local_5f0._32_8_ = local_648.val.field_2._8_8_;
  }
  else {
    local_5f0._8_8_ = local_648.val._M_dataplus._M_p;
  }
  local_5f0._16_8_ = local_648.val._M_string_length;
  local_648.val._M_string_length = 0;
  local_648.val.field_2._M_local_buf[0] = '\0';
  local_5f0._40_8_ =
       local_648.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5f0._48_8_ =
       local_648.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_5f0._56_8_ =
       local_648.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_648.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_648.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_648.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f0._64_4_ =
       local_648.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_5f0._68_4_ =
       local_648.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_5f0._72_4_ =
       local_648.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_5f0._76_4_ =
       local_648.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_5f0._80_8_ =
       local_648.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_648.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_648.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_648.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_598 = 2;
  local_668[0] = local_658;
  local_648.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"Show private keys","");
  local_6a8 = &local_698;
  local_6b0 = 0;
  local_6a0 = 0;
  local_698 = 0;
  local_688._0_8_ = (pointer)0x0;
  local_688._8_2_ = 0;
  local_688._10_6_ = 0;
  local_688._16_2_ = 0;
  local_688._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec9c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec98;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  name_00.field_2._8_8_ = in_stack_ffffffffffffecb0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffecc0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffecb8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffecc8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffecd8._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffecd8._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffecd8._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffecf0._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffecf0._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffecf0._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffed08;
  description_10._M_string_length = (size_type)in_stack_ffffffffffffed20;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed18;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffed28;
  description_10.field_2._8_8_ = in_stack_ffffffffffffed30;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed40;
  opts_00._0_8_ = in_stack_ffffffffffffed38;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffed48;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed50._0_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffed50._16_24_;
  opts_00.hidden = (bool)in_stack_ffffffffffffed50[0x28];
  opts_00.also_positional = (bool)in_stack_ffffffffffffed50[0x29];
  opts_00._66_6_ = in_stack_ffffffffffffed50._42_6_;
  ::RPCArg::RPCArg(&local_328,name_00,(Type)local_590,fallback_00,description_10,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_430;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(local_11d0,__l,&local_11d3);
  local_6f0 = &local_6e0;
  local_6f8[0] = 0;
  local_6e8 = 0;
  local_6e0 = 0;
  local_6d0._0_8_ = (pointer)0x0;
  local_6d0._8_2_ = 0;
  local_6d0._10_6_ = 0;
  local_6d0._16_2_ = 0;
  local_6d0._18_8_ = 0;
  puVar11 = local_6f8;
  name_01._M_string_length = (size_type)in_RDI;
  name_01._M_dataplus._M_p = puVar11;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  name_01.field_2._8_8_ = in_stack_ffffffffffffecb0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffecc0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffecb8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffecc8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffecd8._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffecd8._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffecd8._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffecf0._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffecf0._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffecf0._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffed08;
  description_11._M_string_length = (size_type)in_stack_ffffffffffffed20;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed18;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffed28;
  description_11.field_2._8_8_ = in_stack_ffffffffffffed30;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffed40;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffed38;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffed48;
  ::RPCArg::RPCArg(&local_180,name_01,(Type)local_1a0,fallback_01,description_11,inner,
                   (RPCArgOptions *)0x5);
  __l_00._M_len = 1;
  __l_00._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(local_11d0 + 1,__l_00,&local_11d4);
  local_7a0[0] = local_790;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"");
  local_7c0[0] = local_7b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"");
  local_868[0] = local_858;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_868,"");
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"");
  local_ac8[0] = (pointer)local_ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"xpub","");
  local_ae8[0] = local_ad8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"The extended public key","");
  local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = puVar11;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffecb0;
  description._M_string_length = in_stack_ffffffffffffecc0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description.field_2 = in_stack_ffffffffffffecc8;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_ab8 + 0x10),STR,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,
             SUB81(local_ac8,0));
  local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"has_private","");
  local_b28[0] = local_b18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b28,"Whether the wallet has the private key for this xpub","");
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = puVar11;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffecb0;
  description_00._M_string_length = in_stack_ffffffffffffecc0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description_00.field_2 = in_stack_ffffffffffffecc8;
  ::RPCResult::RPCResult
            (&local_a20,BOOL,m_key_name_00,description_00,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,
             SUB81(&local_b08,0));
  local_b48[0] = local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"xprv","");
  uVar12 = (undefined4)((ulong)puVar11 >> 0x20);
  local_b68[0] = local_b58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b68,"The extended private key if \"private\" is true","");
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = 0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = uVar12;
  auVar5._12_8_ = in_stack_ffffffffffffeca8;
  auVar5._20_8_ = in_stack_ffffffffffffecb0;
  auVar5._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffecc0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description_01.field_2 = in_stack_ffffffffffffecc8;
  ::RPCResult::RPCResult
            (&local_998,STR,(string)(auVar5 << 0x20),SUB81(local_b48,0),description_01,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,true);
  local_b88[0] = local_b78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"descriptors","");
  local_ba8[0] = local_b98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ba8,"Array of descriptor objects that use this HD key","");
  local_c50[0] = local_c40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c50,"");
  local_c70[0] = local_c60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c70,"");
  local_da0[0] = (pointer)local_d90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_da0,"desc","");
  local_dc0[0] = local_db0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dc0,"Descriptor string representation","");
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar12;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffecb0;
  description_02._M_string_length = in_stack_ffffffffffffecc0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description_02.field_2 = in_stack_ffffffffffffecc8;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_d90 + 0x10),STR,m_key_name_01,description_02,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,
             SUB81(local_da0,0));
  local_de0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_de0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_de0,"active","");
  local_e00[0] = local_df0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e00,
             "Whether this descriptor is currently used to generate new addresses","");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar12;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffecb0;
  description_03._M_string_length = in_stack_ffffffffffffecc0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description_03.field_2._M_local_buf = in_stack_ffffffffffffecc8._M_local_buf;
  ::RPCResult::RPCResult
            (&local_cf8,BOOL,m_key_name_02,description_03,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,
             SUB81(&local_de0,0));
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)(local_d90 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed58,__l_01,
             (allocator_type *)&stack0xffffffffffffed17);
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar12;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffecb0;
  description_04._M_string_length = in_stack_ffffffffffffecc0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description_04.field_2._M_local_buf = in_stack_ffffffffffffecc8._M_local_buf;
  ::RPCResult::RPCResult
            (&local_c30,OBJ,m_key_name_03,description_04,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,
             SUB81(local_c50,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_c30;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed70,__l_02,
             (allocator_type *)&stack0xffffffffffffed16);
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar12;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffecb0;
  description_05._M_string_length = in_stack_ffffffffffffecc0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description_05.field_2._M_local_buf = in_stack_ffffffffffffecc8._M_local_buf;
  ::RPCResult::RPCResult
            (&local_910,ARR,m_key_name_04,description_05,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,
             SUB81(local_b88,0));
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)(local_ab8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1220,__l_03,(allocator_type *)&stack0xffffffffffffed15);
  m_key_name_05._M_dataplus._M_p._4_4_ = uVar12;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffecb0;
  description_06._M_string_length = in_stack_ffffffffffffecc0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description_06.field_2._M_local_buf = in_stack_ffffffffffffecc8._M_local_buf;
  ::RPCResult::RPCResult
            (&local_848,OBJ,m_key_name_05,description_06,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,
             SUB81(local_868,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_848;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1208,__l_04,(allocator_type *)&stack0xffffffffffffed14);
  m_key_name_06._M_dataplus._M_p._4_4_ = uVar12;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffeca8;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffecb0;
  description_07._M_string_length = in_stack_ffffffffffffecc0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecb8;
  description_07.field_2 = in_stack_ffffffffffffecc8;
  ::RPCResult::RPCResult
            (&local_780,ARR,m_key_name_06,description_07,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffecd8,
             SUB81(local_7a0,0));
  result._4_4_ = uVar12;
  result.m_type = uVar10;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffeca8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffecb0;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffecb8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffecc0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffecc8;
  result._64_24_ = in_stack_ffffffffffffecd8;
  result._88_24_ = in_stack_ffffffffffffecf0;
  result.m_cond._8_16_ = in_stack_ffffffffffffed08;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults(&local_11f0,result);
  local_ec0._M_dataplus._M_p = (pointer)&local_ec0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ec0,"gethdkeys","");
  local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee0,"");
  HelpExampleCli(&local_ea0,&local_ec0,&local_ee0);
  local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f20,"gethdkeys","");
  local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f40,"");
  HelpExampleRpc(&local_f00,&local_f20,&local_f40);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
    uVar8 = local_ea0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_f00._M_string_length + local_ea0._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
      uVar8 = local_f00.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_f00._M_string_length + local_ea0._M_string_length) goto LAB_00bc697e;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f00,0,0,local_ea0._M_dataplus._M_p,local_ea0._M_string_length);
  }
  else {
LAB_00bc697e:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_ea0,local_f00._M_dataplus._M_p,local_f00._M_string_length);
  }
  local_e80._M_dataplus._M_p = (pointer)&local_e80.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar2 == paVar1) {
    local_e80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_e80.field_2._8_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 8);
    local_e80.field_2._12_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
  }
  else {
    local_e80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_e80._M_dataplus._M_p = (pointer)paVar2;
  }
  local_e80._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_f80._M_dataplus._M_p = (pointer)&local_f80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f80,"gethdkeys","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[5],_true>
            (&local_1070,(char (*) [12])"active_only",(char (*) [5])0x111f0b5);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[8],_const_char_(&)[5],_true>
            (&local_ff8,(char (*) [8])0x1106bc9,(char (*) [5])0x111f0b5);
  __l_05._M_len = 2;
  __l_05._M_array = &local_1070;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xffffffffffffecf8,__l_05,(allocator_type *)&stack0xffffffffffffecf7);
  HelpExampleCliNamed(&local_f60,&local_f80,(RPCArgList *)&stack0xffffffffffffecf8);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80._M_dataplus._M_p != &local_e80.field_2) {
    uVar8 = local_e80.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_f60._M_string_length + local_e80._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
      uVar8 = local_f60.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_f60._M_string_length + local_e80._M_string_length) goto LAB_00bc6ade;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f60,0,0,local_e80._M_dataplus._M_p,local_e80._M_string_length);
  }
  else {
LAB_00bc6ade:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_e80,local_f60._M_dataplus._M_p,local_f60._M_string_length);
  }
  local_e60._M_dataplus._M_p = (pointer)&local_e60.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar2 == paVar1) {
    local_e60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_e60.field_2._8_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 8);
    local_e60.field_2._12_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
  }
  else {
    local_e60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_e60._M_dataplus._M_p = (pointer)paVar2;
  }
  local_e60._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_10b0._0_8_ = local_10b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10b0,"gethdkeys","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[5],_true>
            (&local_11a0,(char (*) [12])"active_only",(char (*) [5])0x111f0b5);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[8],_const_char_(&)[5],_true>
            (&local_1128,(char (*) [8])0x1106bc9,(char (*) [5])0x111f0b5);
  __l_06._M_len = 2;
  __l_06._M_array = &local_11a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xffffffffffffecd8,__l_06,(allocator_type *)&stack0xffffffffffffecd7);
  HelpExampleRpcNamed((string *)local_1090,(string *)local_10b0,
                      (RPCArgList *)&stack0xffffffffffffecd8);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._M_dataplus._M_p != &local_e60.field_2) {
    uVar8 = local_e60.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_1090._8_8_ + local_e60._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1090._0_8_ != &local_1080) {
      uVar8 = local_1080._M_allocated_capacity;
    }
    if (local_1090._8_8_ + local_e60._M_string_length <= (ulong)uVar8) {
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1090,0,0,local_e60._M_dataplus._M_p,local_e60._M_string_length);
      goto LAB_00bc6c5e;
    }
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_e60,(char *)local_1090._0_8_,local_1090._8_8_);
LAB_00bc6c5e:
  local_e40 = &local_e30;
  puVar3 = (ulong *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar1) {
    local_e30 = paVar1->_M_allocated_capacity;
    uStack_e28 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_e30 = paVar1->_M_allocated_capacity;
    local_e40 = puVar3;
  }
  local_e18 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_e40 == &local_e30) {
    uStack_e08 = uStack_e28;
    local_e20 = &local_e10;
  }
  else {
    local_e20 = local_e40;
  }
  local_e10 = local_e30;
  local_e38 = 0;
  local_e30 = local_e30 & 0xffffffffffffff00;
  pcVar13 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/wallet.cpp:849:9)>
            ::_M_manager;
  description_08._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/wallet.cpp:849:9)>
       ::_M_invoke;
  description_08._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/wallet.cpp:849:9)>
                ::_M_manager;
  description_08.field_2 = in_stack_ffffffffffffecc8;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed08._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffed08._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar15;
  local_e40 = &local_e30;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffeca8)),description_08,
             (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_ffffffffffffecd8,
             (RPCResults)in_stack_ffffffffffffecf0,examples,(RPCMethodImpl *)&local_58);
  if (pcVar13 != (code *)0x0) {
    (*pcVar13)(&stack0xffffffffffffeca8,&stack0xffffffffffffeca8,3);
  }
  if (local_e20 != &local_e10) {
    operator_delete(local_e20,local_e10 + 1);
  }
  if (local_e40 != &local_e30) {
    operator_delete(local_e40,local_e30 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090._0_8_ != &local_1080) {
    operator_delete((void *)local_1090._0_8_,local_1080._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xffffffffffffecd8);
  lVar9 = 0xf0;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)
               ((long)&local_11d0[1].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_11d0[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar9));
    plVar4 = *(long **)((long)&local_11f0.m_results.
                               super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar9);
    plVar7 = (long *)((long)&local_11f0.m_results.
                             super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + lVar9);
    if (plVar7 != plVar4) {
      operator_delete(plVar4,*plVar7 + 1);
    }
    plVar7 = (long *)((long)&local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar9);
    plVar4 = *(long **)((long)&local_1220.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar9);
    if (plVar7 != plVar4) {
      operator_delete(plVar4,*plVar7 + 1);
    }
    lVar9 = lVar9 + -0x78;
  } while (lVar9 != 0);
  if ((undefined1 *)local_10b0._0_8_ != local_10b0 + 0x10) {
    operator_delete((void *)local_10b0._0_8_,local_10b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._M_dataplus._M_p != &local_e60.field_2) {
    operator_delete(local_e60._M_dataplus._M_p,local_e60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
    operator_delete(local_f60._M_dataplus._M_p,local_f60.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xffffffffffffecf8);
  lVar9 = 0xf0;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)(local_1090 + lVar9 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_10b0 + lVar9 + 0x10));
    if ((long *)(local_10b0 + lVar9) != *(long **)(local_10b0 + lVar9 + -0x10)) {
      operator_delete(*(long **)(local_10b0 + lVar9 + -0x10),*(long *)(local_10b0 + lVar9) + 1);
    }
    if ((long *)(local_10b0 + lVar9 + -0x28) != *(long **)(local_10b0 + lVar9 + -0x38)) {
      operator_delete(*(long **)(local_10b0 + lVar9 + -0x38),
                      *(long *)(local_10b0 + lVar9 + -0x28) + 1);
    }
    lVar9 = lVar9 + -0x78;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f80._M_dataplus._M_p != &local_f80.field_2) {
    operator_delete(local_f80._M_dataplus._M_p,local_f80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80._M_dataplus._M_p != &local_e80.field_2) {
    operator_delete(local_e80._M_dataplus._M_p,local_e80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
    operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
    operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
    operator_delete(local_ea0._M_dataplus._M_p,local_ea0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
    operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ec0._M_dataplus._M_p != &local_ec0.field_2) {
    operator_delete(local_ec0._M_dataplus._M_p,local_ec0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11f0.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780.m_cond._M_dataplus._M_p != &local_780.m_cond.field_2) {
    operator_delete(local_780.m_cond._M_dataplus._M_p,
                    local_780.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780.m_description._M_dataplus._M_p != &local_780.m_description.field_2) {
    operator_delete(local_780.m_description._M_dataplus._M_p,
                    local_780.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_780.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780.m_key_name._M_dataplus._M_p != &local_780.m_key_name.field_2) {
    operator_delete(local_780.m_key_name._M_dataplus._M_p,
                    local_780.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848.m_cond._M_dataplus._M_p != &local_848.m_cond.field_2) {
    operator_delete(local_848.m_cond._M_dataplus._M_p,
                    local_848.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848.m_description._M_dataplus._M_p != &local_848.m_description.field_2) {
    operator_delete(local_848.m_description._M_dataplus._M_p,
                    local_848.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_848.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848.m_key_name._M_dataplus._M_p != &local_848.m_key_name.field_2) {
    operator_delete(local_848.m_key_name._M_dataplus._M_p,
                    local_848.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1220);
  lVar9 = 0x220;
  do {
    if ((long *)(local_ab8 + lVar9) != *(long **)((long)local_ac8 + lVar9)) {
      operator_delete(*(long **)((long)local_ac8 + lVar9),*(long *)(local_ab8 + lVar9) + 1);
    }
    if ((long *)((long)local_ad8 + lVar9) != *(long **)((long)local_ae8 + lVar9)) {
      operator_delete(*(long **)((long)local_ae8 + lVar9),*(long *)((long)local_ad8 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_b18 + lVar9) != *(long **)((long)local_b28 + lVar9)) {
      operator_delete(*(long **)((long)local_b28 + lVar9),*(long *)((long)local_b18 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30.m_cond._M_dataplus._M_p != &local_c30.m_cond.field_2) {
    operator_delete(local_c30.m_cond._M_dataplus._M_p,
                    local_c30.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30.m_description._M_dataplus._M_p != &local_c30.m_description.field_2) {
    operator_delete(local_c30.m_description._M_dataplus._M_p,
                    local_c30.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c30.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30.m_key_name._M_dataplus._M_p != &local_c30.m_key_name.field_2) {
    operator_delete(local_c30.m_key_name._M_dataplus._M_p,
                    local_c30.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed58);
  lVar9 = 0x110;
  do {
    if ((long *)(local_d90 + lVar9) != *(long **)((long)local_da0 + lVar9)) {
      operator_delete(*(long **)((long)local_da0 + lVar9),*(long *)(local_d90 + lVar9) + 1);
    }
    if ((long *)((long)local_db0 + lVar9) != *(long **)((long)local_dc0 + lVar9)) {
      operator_delete(*(long **)((long)local_dc0 + lVar9),*(long *)((long)local_db0 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_de0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_df0 + lVar9) != *(long **)((long)local_e00 + lVar9)) {
      operator_delete(*(long **)((long)local_e00 + lVar9),*(long *)((long)local_df0 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed18);
  if (local_e00[0] != local_df0) {
    operator_delete(local_e00[0],local_df0[0] + 1);
  }
  if (local_de0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_de0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_de0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_de0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed38);
  if (local_dc0[0] != local_db0) {
    operator_delete(local_dc0[0],local_db0[0] + 1);
  }
  if (local_da0[0] != (pointer)local_d90) {
    operator_delete(local_da0[0],local_d90._0_8_ + 1);
  }
  if (local_c70[0] != local_c60) {
    operator_delete(local_c70[0],local_c60[0] + 1);
  }
  if (local_c50[0] != local_c40) {
    operator_delete(local_c50[0],local_c40[0] + 1);
  }
  if (local_ba8[0] != local_b98) {
    operator_delete(local_ba8[0],local_b98[0] + 1);
  }
  if (local_b88[0] != local_b78) {
    operator_delete(local_b88[0],local_b78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1278);
  if (local_b68[0] != local_b58) {
    operator_delete(local_b68[0],local_b58[0] + 1);
  }
  if (local_b48[0] != local_b38) {
    operator_delete(local_b48[0],local_b38[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1258);
  if (local_b28[0] != local_b18) {
    operator_delete(local_b28[0],local_b18[0] + 1);
  }
  if (local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_b08.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1238);
  if (local_ae8[0] != local_ad8) {
    operator_delete(local_ae8[0],local_ad8[0] + 1);
  }
  if (local_ac8[0] != (pointer)local_ab8) {
    operator_delete(local_ac8[0],local_ab8._0_8_ + 1);
  }
  if (local_888[0] != local_878) {
    operator_delete(local_888[0],local_878[0] + 1);
  }
  if (local_868[0] != local_858) {
    operator_delete(local_868[0],local_858[0] + 1);
  }
  if (local_7c0[0] != local_7b0) {
    operator_delete(local_7c0[0],local_7b0[0] + 1);
  }
  if (local_7a0[0] != local_790) {
    operator_delete(local_7a0[0],local_790[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(local_11d0 + 1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_6d0);
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0,CONCAT71(uStack_6df,local_6e0) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(local_11d0);
  lVar9 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_450.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar9));
    if ((long *)(local_4b0 + lVar9 + 0x50) != *(long **)(local_4b0 + lVar9 + 0x40)) {
      operator_delete(*(long **)(local_4b0 + lVar9 + 0x40),*(long *)(local_4b0 + lVar9 + 0x50) + 1);
    }
    if ((long *)(local_4b0 + lVar9 + 0x28) != *(long **)(local_4b0 + lVar9 + 0x18)) {
      operator_delete(*(long **)(local_4b0 + lVar9 + 0x18),*(long *)(local_4b0 + lVar9 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_508 + lVar9 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_510 + lVar9));
    if ((long *)((long)local_528 + lVar9) != *(long **)(local_548 + lVar9 + 0x10)) {
      operator_delete(*(long **)(local_548 + lVar9 + 0x10),*(long *)((long)local_528 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x108;
  } while (lVar9 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_688);
  if (local_6a8 != &local_698) {
    operator_delete(local_6a8,CONCAT71(uStack_697,local_698) + 1);
  }
  if (local_668[0] != local_658) {
    operator_delete(local_668[0],local_658[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_5f0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_648.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_648.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648.val._M_dataplus._M_p != &local_648.val.field_2) {
    operator_delete(local_648.val._M_dataplus._M_p,
                    CONCAT71(local_648.val.field_2._M_allocated_capacity._1_7_,
                             local_648.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_590[0] != local_580) {
    operator_delete(local_590[0],local_580[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_548);
  if (local_568 != &local_558) {
    operator_delete(local_568,CONCAT71(uStack_557,local_558) + 1);
  }
  if (local_528[0] != &local_518) {
    operator_delete(local_528[0],local_518 + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_4b0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._8_8_ != &local_4f0) {
    operator_delete((void *)local_508._8_8_,
                    CONCAT71(local_4f0._M_allocated_capacity._1_7_,local_4f0._M_local_buf[0]) + 1);
  }
  if (local_450.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_450.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_450.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_450.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan gethdkeys()
{
    return RPCHelpMan{
        "gethdkeys",
        "\nList all BIP 32 HD keys in the wallet and which descriptors use them.\n",
        {
            {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "", {
                {"active_only", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show the keys for only active descriptors"},
                {"private", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show private keys"}
            }},
        },
        RPCResult{RPCResult::Type::ARR, "", "", {
            {
                {RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::STR, "xpub", "The extended public key"},
                    {RPCResult::Type::BOOL, "has_private", "Whether the wallet has the private key for this xpub"},
                    {RPCResult::Type::STR, "xprv", /*optional=*/true, "The extended private key if \"private\" is true"},
                    {RPCResult::Type::ARR, "descriptors", "Array of descriptor objects that use this HD key",
                    {
                        {RPCResult::Type::OBJ, "", "", {
                            {RPCResult::Type::STR, "desc", "Descriptor string representation"},
                            {RPCResult::Type::BOOL, "active", "Whether this descriptor is currently used to generate new addresses"},
                        }},
                    }},
                }},
            }
        }},
        RPCExamples{
            HelpExampleCli("gethdkeys", "") + HelpExampleRpc("gethdkeys", "")
            + HelpExampleCliNamed("gethdkeys", {{"active_only", "true"}, {"private", "true"}}) + HelpExampleRpcNamed("gethdkeys", {{"active_only", "true"}, {"private", "true"}})
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::shared_ptr<const CWallet> wallet = GetWalletForJSONRPCRequest(request);
            if (!wallet) return UniValue::VNULL;

            if (!wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                throw JSONRPCError(RPC_WALLET_ERROR, "gethdkeys is not available for non-descriptor wallets");
            }

            LOCK(wallet->cs_wallet);

            UniValue options{request.params[0].isNull() ? UniValue::VOBJ : request.params[0]};
            const bool active_only{options.exists("active_only") ? options["active_only"].get_bool() : false};
            const bool priv{options.exists("private") ? options["private"].get_bool() : false};
            if (priv) {
                EnsureWalletIsUnlocked(*wallet);
            }


            std::set<ScriptPubKeyMan*> spkms;
            if (active_only) {
                spkms = wallet->GetActiveScriptPubKeyMans();
            } else {
                spkms = wallet->GetAllScriptPubKeyMans();
            }

            std::map<CExtPubKey, std::set<std::tuple<std::string, bool, bool>>> wallet_xpubs;
            std::map<CExtPubKey, CExtKey> wallet_xprvs;
            for (auto* spkm : spkms) {
                auto* desc_spkm{dynamic_cast<DescriptorScriptPubKeyMan*>(spkm)};
                CHECK_NONFATAL(desc_spkm);
                LOCK(desc_spkm->cs_desc_man);
                WalletDescriptor w_desc = desc_spkm->GetWalletDescriptor();

                // Retrieve the pubkeys from the descriptor
                std::set<CPubKey> desc_pubkeys;
                std::set<CExtPubKey> desc_xpubs;
                w_desc.descriptor->GetPubKeys(desc_pubkeys, desc_xpubs);
                for (const CExtPubKey& xpub : desc_xpubs) {
                    std::string desc_str;
                    bool ok = desc_spkm->GetDescriptorString(desc_str, false);
                    CHECK_NONFATAL(ok);
                    wallet_xpubs[xpub].emplace(desc_str, wallet->IsActiveScriptPubKeyMan(*spkm), desc_spkm->HasPrivKey(xpub.pubkey.GetID()));
                    if (std::optional<CKey> key = priv ? desc_spkm->GetKey(xpub.pubkey.GetID()) : std::nullopt) {
                        wallet_xprvs[xpub] = CExtKey(xpub, *key);
                    }
                }
            }

            UniValue response(UniValue::VARR);
            for (const auto& [xpub, descs] : wallet_xpubs) {
                bool has_xprv = false;
                UniValue descriptors(UniValue::VARR);
                for (const auto& [desc, active, has_priv] : descs) {
                    UniValue d(UniValue::VOBJ);
                    d.pushKV("desc", desc);
                    d.pushKV("active", active);
                    has_xprv |= has_priv;

                    descriptors.push_back(std::move(d));
                }
                UniValue xpub_info(UniValue::VOBJ);
                xpub_info.pushKV("xpub", EncodeExtPubKey(xpub));
                xpub_info.pushKV("has_private", has_xprv);
                if (priv) {
                    xpub_info.pushKV("xprv", EncodeExtKey(wallet_xprvs.at(xpub)));
                }
                xpub_info.pushKV("descriptors", std::move(descriptors));

                response.push_back(std::move(xpub_info));
            }

            return response;
        },
    };
}